

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int32_t peek(Env *env,uint32_t rel)

{
  uint32_t rel_local;
  Env *env_local;
  
  if ((env->state->lookahead).offset + rel < (env->state->lookahead).size) {
    env_local._4_4_ = unsafe_peek(env,rel);
  }
  else {
    advance_before(env,rel);
    env_local._4_4_ = env->lexer->lookahead;
  }
  return env_local._4_4_;
}

Assistant:

static int32_t peek(Env *env, uint32_t rel) {
#ifdef TREE_SITTER_DEBUG
  debug_peek(env, rel);
#endif
  if (env->state->lookahead.offset + rel < env->state->lookahead.size) return unsafe_peek(env, rel);
  else {
    advance_before(env, rel);
    return PEEK;
  }
}